

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_fading_colour.c
# Opt level: O2

HRESULT frame_completed(void *context,cdecklink_video_frame_t *frame,
                       DecklinkOutputFrameCompletionResult result)

{
  HRESULT HVar1;
  cdecklink_video_frame_t_conflict *theFrame;
  char *__s;
  
  if (frame != (cdecklink_video_frame_t *)0x0) {
    cdecklink_video_frame_release((cdecklink_video_frame_t_conflict *)frame);
  }
  if (context == (void *)0x0) {
    __s = "No output in callback";
  }
  else {
    theFrame = (cdecklink_video_frame_t_conflict *)generate_next_frame(context);
    if (theFrame == (cdecklink_video_frame_t_conflict *)0x0) {
      __s = "Failed to generate next frame";
    }
    else {
      HVar1 = cdecklink_output_schedule_video_frame
                        ((cdecklink_output_t_conflict *)context,theFrame,scheduled,1000,25000);
      if (HVar1 == 0) {
        scheduled = scheduled + 1000;
        return 0;
      }
      __s = "Failed to schedule next frame";
    }
  }
  puts(__s);
  return 1;
}

Assistant:

HRESULT frame_completed(void *context, cdecklink_video_frame_t *frame,
                        DecklinkOutputFrameCompletionResult result) {
//    printf("frame completed\n");

    if (frame != NULL) {
        cdecklink_video_frame_release(frame); // TODO - leaking the mutable wrapper
    }

    if (context == NULL) {
        printf("No output in callback\n");
        return S_FALSE;
    }
    cdecklink_output_t *output = context;

    cdecklink_video_frame_t *next_frame = generate_next_frame(output);
    if (next_frame == NULL) {
        printf("Failed to generate next frame\n");
        return S_FALSE;
    }

    if (cdecklink_output_schedule_video_frame(output, next_frame, scheduled, 1000, 25000) != S_OK) {
        printf("Failed to schedule next frame\n");
        return S_FALSE;
    }

    scheduled += 1000;

    return S_OK;
}